

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_refs.c
# Opt level: O0

RK_S32 mpp_hevc_frame_rps(HEVCContext *s)

{
  ShortTermRPS *pSVar1;
  int iVar2;
  LongTermRPS *pLVar3;
  bool bVar4;
  HEVCFrame *ref;
  int list_1;
  int poc_1;
  int list;
  int poc;
  HEVCFrame *frame;
  RK_U32 i;
  RK_S32 ret;
  RefPicList *rps;
  LongTermRPS *long_rps;
  ShortTermRPS *short_rps;
  HEVCContext *s_local;
  
  pSVar1 = (s->sh).short_term_rps;
  pLVar3 = &(s->sh).long_term_rps;
  if (pSVar1 == (ShortTermRPS *)0x0) {
    s->rps[1].nb_refs = 0;
    s->rps[0].nb_refs = 0;
    return 0;
  }
  for (frame._0_4_ = 0; (uint)frame < 0x11; frame._0_4_ = (uint)frame + 1) {
    mark_ref(s->DPB + (uint)frame,0);
  }
  for (frame._0_4_ = 0; (uint)frame < 5; frame._0_4_ = (uint)frame + 1) {
    s->rps[(uint)frame].nb_refs = 0;
  }
  frame._0_4_ = 0;
  while( true ) {
    bVar4 = false;
    if (pSVar1 != (ShortTermRPS *)0x0) {
      bVar4 = (int)(uint)frame < pSVar1->num_delta_pocs;
    }
    if (!bVar4) {
      frame._0_4_ = 0;
      while( true ) {
        bVar4 = false;
        if (pLVar3 != (LongTermRPS *)0x0) {
          bVar4 = (uint)frame < (s->sh).long_term_rps.nb_refs;
        }
        if (!bVar4) break;
        iVar2 = 4;
        if ((s->sh).long_term_rps.used[(uint)frame] != '\0') {
          iVar2 = 3;
        }
        iVar2 = add_candidate_ref(s,s->rps + iVar2,pLVar3->poc[(uint)frame],4,(uint)(iVar2 != 4));
        if (iVar2 < 0) {
          return iVar2;
        }
        frame._0_4_ = (uint)frame + 1;
      }
      for (frame._0_4_ = 0; (uint)frame < 0x11; frame._0_4_ = (uint)frame + 1) {
        mpp_hevc_unref_frame(s,s->DPB + (uint)frame,0);
      }
      if (s->nal_unit_type == NAL_CRA_NUT) {
        for (frame._0_4_ = 0; (uint)frame < 0x11; frame._0_4_ = (uint)frame + 1) {
          if ((s->DPB[(uint)frame].slot_index != 0xff) && (s->poc < s->DPB[(uint)frame].poc)) {
            h265d_flush(s->h265dctx);
            return 0;
          }
        }
      }
      return 0;
    }
    if (pSVar1->used[(uint)frame] == '\0') {
      list_1 = 2;
    }
    else {
      list_1 = (int)(pSVar1->num_negative_pics <= (uint)frame);
    }
    iVar2 = add_candidate_ref(s,s->rps + list_1,s->poc + pSVar1->delta_poc[(uint)frame],2,
                              (uint)(list_1 != 2));
    if (iVar2 < 0) break;
    frame._0_4_ = (uint)frame + 1;
  }
  return iVar2;
}

Assistant:

RK_S32 mpp_hevc_frame_rps(HEVCContext *s)
{

    const ShortTermRPS *short_rps = s->sh.short_term_rps;
    const LongTermRPS  *long_rps  = &s->sh.long_term_rps;
    RefPicList               *rps = s->rps;
    RK_S32  ret;
    RK_U32  i;

    if (!short_rps) {
        rps[0].nb_refs = rps[1].nb_refs = 0;
        return 0;
    }

    /* clear the reference flags on all frames except the current one */
    for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
        HEVCFrame *frame = &s->DPB[i];
        mark_ref(frame, 0);
    }

    for (i = 0; i < NB_RPS_TYPE; i++)
        rps[i].nb_refs = 0;

    /* add the short refs */
    for (i = 0; short_rps && (RK_S32)i < short_rps->num_delta_pocs; i++) {
        int poc = s->poc + short_rps->delta_poc[i];
        int list;

        if (!short_rps->used[i])
            list = ST_FOLL;
        else if (i < short_rps->num_negative_pics)
            list = ST_CURR_BEF;
        else
            list = ST_CURR_AFT;

        ret = add_candidate_ref(s, &rps[list], poc, HEVC_FRAME_FLAG_SHORT_REF, ST_FOLL != list);
        if (ret < 0)
            return ret;
    }

    /* add the long refs */
    for (i = 0; long_rps && i < long_rps->nb_refs; i++) {
        int poc  = long_rps->poc[i];
        int list = long_rps->used[i] ? LT_CURR : LT_FOLL;

        ret = add_candidate_ref(s, &rps[list], poc, HEVC_FRAME_FLAG_LONG_REF, LT_FOLL != list);
        if (ret < 0)
            return ret;
    }
    /* release any frames that are now unused */
    for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
        mpp_hevc_unref_frame(s, &s->DPB[i], 0);
    }
    /*
     * flush for CRA frame if there has frame poc > cur poc in dpb.
     */
    if (IS_CRA(s)) {
        for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
            HEVCFrame *ref = &s->DPB[i];

            if ((ref->slot_index != 0xff) && (ref->poc > s->poc)) {
                h265d_flush(s->h265dctx);
                break;
            }
        }
    }

    return 0;
}